

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selist.c
# Opt level: O3

_Bool selist_set_insert(selist **qlp,void *data,cmp_cb cmp)

{
  selist *psVar1;
  selist *psVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  code *pcVar6;
  ulong uVar7;
  
  psVar1 = *qlp;
  if (psVar1 != (selist *)0x0) {
    pcVar6 = cmp_voidptr;
    if (cmp != (cmp_cb)0x0) {
      pcVar6 = cmp;
    }
    iVar5 = psVar1->num_elements;
    while (psVar2 = psVar1, lVar3 = (long)&psVar2->num_elements, 0 < iVar5) {
      iVar4 = (*pcVar6)(*(void **)((long)psVar2->elements + (ulong)(iVar5 - 1) * 8),data);
      iVar5 = psVar2->num_elements;
      if (-1 < iVar4) break;
      if (iVar5 != 0xe) {
        if (psVar2->next == (selist *)0x0) {
LAB_00108336:
          *(int *)lVar3 = iVar5 + 1;
          psVar2->elements[iVar5] = data;
          return true;
        }
        iVar5 = (*pcVar6)(psVar2->next->elements[0],data);
        if (0 < iVar5) {
          iVar5 = *(int *)lVar3;
          goto LAB_00108336;
        }
      }
      psVar1 = psVar2->next;
      qlp = &psVar2->next;
      if (psVar1 == (selist *)0x0) goto LAB_00108302;
      iVar5 = psVar1->num_elements;
    }
    if (iVar5 != 0) {
      uVar7 = 0;
      do {
        iVar5 = (*pcVar6)(data,psVar2->elements[uVar7]);
        if (iVar5 < 0) {
          selist_insert(qlp,(int)uVar7,data);
          return true;
        }
        if (iVar5 == 0) {
          return false;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != *(uint *)lVar3);
    }
  }
LAB_00108302:
  selist_push(qlp,data);
  return true;
}

Assistant:

bool selist_set_insert(struct selist **qlp, void *data, cmp_cb cmp)
{
    if (*qlp) {
        selist *ql = *qlp;
        if (cmp==NULL) cmp = cmp_voidptr;
        if (ql->num_elements > 0 && cmp(ql->elements[ql->num_elements - 1], data) < 0) {
            if (ql->num_elements == LIST_MAXSIZE || (ql->next
                && cmp(ql->next->elements[0], data) <= 0)) {
                return selist_set_insert(&ql->next, data, cmp);
            }
            else {
                ql->elements[ql->num_elements++] = data;
            }
            return true;
        }
        else {
            int i;
            /* TODO: OPT | binary search */
            for (i = 0; i != ql->num_elements; ++i) {
                int cmpi = cmp(data, ql->elements[i]);
                if (cmpi < 0) {
                    selist_insert(qlp, i, data);
                    return true;
                }
                if (cmpi == 0) {
                    return false;
                }
            }
        }
    }
    selist_push(qlp, data);
    return true;
}